

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool google::protobuf::anon_unknown_23::IsSubSymbol(string_view sub_symbol,string_view super_symbol)

{
  int iVar1;
  char *__s2;
  ulong __n;
  size_type __rlen;
  bool bVar2;
  
  __n = sub_symbol._M_len;
  __s2 = super_symbol._M_str;
  if (__n == super_symbol._M_len) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp(sub_symbol._M_str,__s2,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if ((__n == 0) ||
     ((__n <= super_symbol._M_len && (iVar1 = bcmp(__s2,sub_symbol._M_str,__n), iVar1 == 0)))) {
    bVar2 = __s2[__n] == '.';
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsSubSymbol(absl::string_view sub_symbol, absl::string_view super_symbol) {
  return sub_symbol == super_symbol ||
         (absl::StartsWith(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}